

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::ubo::anon_unknown_0::UniformBlockCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UniformBlockCaseInstance *this)

{
  allocator<vk::VkDescriptorBufferInfo> *this_00;
  uint uVar1;
  uint uVar2;
  VkDescriptorSet destSet;
  VkRenderPass renderPass_00;
  VkShaderModule vtxShaderModule_00;
  VkShaderModule fragShaderModule_00;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar3;
  deUint64 dVar4;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_03;
  RefData<vk::Handle<(vk::HandleType)8>_> data_04;
  RefData<vk::Handle<(vk::HandleType)8>_> data_05;
  RefData<vk::Handle<(vk::HandleType)9>_> data_06;
  RefData<vk::Handle<(vk::HandleType)13>_> data_07;
  RefData<vk::Handle<(vk::HandleType)19>_> data_08;
  RefData<vk::Handle<(vk::HandleType)21>_> data_09;
  RefData<vk::Handle<(vk::HandleType)22>_> data_10;
  RefData<vk::Handle<(vk::HandleType)17>_> data_11;
  RefData<vk::Handle<(vk::HandleType)23>_> data_12;
  RefData<vk::Handle<(vk::HandleType)16>_> data_13;
  RefData<vk::Handle<(vk::HandleType)14>_> data_14;
  RefData<vk::Handle<(vk::HandleType)14>_> data_15;
  RefData<vk::Handle<(vk::HandleType)18>_> data_16;
  RefData<vk::Handle<(vk::HandleType)24>_> data_17;
  RefData<vk::VkCommandBuffer_s_*> data_18;
  RefData<vk::Handle<(vk::HandleType)8>_> data_19;
  RefData<vk::Handle<(vk::HandleType)6>_> data_20;
  unsigned_long uVar5;
  BlockLayoutEntry *pBVar6;
  int iVar7;
  deUint32 size_00;
  bool bVar8;
  deInt32 align;
  VkResult VVar9;
  int iVar10;
  DeviceInterface *vkd;
  VkDevice device_00;
  VkQueue pVVar11;
  Handle<(vk::HandleType)8> *pHVar12;
  Allocation *pAVar13;
  void *pvVar14;
  VkDeviceMemory VVar15;
  VkDeviceSize VVar16;
  Handle<(vk::HandleType)9> *pHVar17;
  Handle<(vk::HandleType)21> *pHVar18;
  size_type sVar19;
  pointer ppVar20;
  reference pvVar21;
  Handle<(vk::HandleType)22> *pHVar22;
  uint *puVar23;
  const_reference pvVar24;
  mapped_type_conflict *pmVar25;
  reference pvVar26;
  Handle<(vk::HandleType)17> *pHVar27;
  Handle<(vk::HandleType)13> *pHVar28;
  Handle<(vk::HandleType)19> *pHVar29;
  ProgramCollection<vk::ProgramBinary> *pPVar30;
  ProgramBinary *pPVar31;
  Handle<(vk::HandleType)14> *pHVar32;
  Handle<(vk::HandleType)16> *pHVar33;
  Handle<(vk::HandleType)24> *pHVar34;
  VkCommandBuffer_s **ppVVar35;
  Handle<(vk::HandleType)23> *pHVar36;
  Handle<(vk::HandleType)18> *pHVar37;
  Handle<(vk::HandleType)6> *pHVar38;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar39;
  BlockLayoutEntry *pBVar40;
  const_reference value;
  Context *pCVar41;
  VkClearValue VVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  allocator<char> local_12b1;
  string local_12b0;
  undefined4 local_1290;
  allocator<char> local_1289;
  string local_1288;
  MessageBuilder local_1268;
  unsigned_long local_10e8;
  size_t uniformNdx;
  const_reference local_f60;
  BlockLayoutEntry *block_2;
  size_t blockNdx_4;
  allocator<char> local_dc9;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0;
  LogImage local_d80;
  TestLog *local_cf0;
  TestLog *log;
  int local_ce0;
  int local_cdc;
  int x;
  int y;
  int numFailedPixels;
  RGBA white;
  VkDeviceSize bufferSize;
  ConstPixelBufferAccess imgAccess;
  TextureFormat textureFormat;
  Surface surface;
  undefined8 uStack_c48;
  VkSubmitInfo submitInfo;
  RefData<vk::Handle<(vk::HandleType)6>_> local_be0;
  undefined1 local_bc0 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  VkBufferMemoryBarrier copyFinishBarrier;
  undefined8 uStack_b58;
  VkBufferImageCopy copyParams;
  undefined4 local_b18 [2];
  VkImageMemoryBarrier renderFinishBarrier;
  undefined8 local_ac8;
  VkDeviceSize offsets [1];
  undefined4 local_ab0 [2];
  VkImageMemoryBarrier initializeBarrier;
  VkRenderPassBeginInfo passBeginInfo;
  VkClearValue clearValue;
  VkCommandBufferBeginInfo beginInfo;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_9e8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_9d8;
  undefined1 local_9c8 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> readImageAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_998;
  undefined1 local_978 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> readImageBuffer;
  Move<vk::VkCommandBuffer_s_*> local_950;
  RefData<vk::VkCommandBuffer_s_*> local_930;
  undefined1 local_910 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_8d0;
  undefined1 local_8b0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_870;
  RefData<vk::Handle<(vk::HandleType)18>_> local_850;
  undefined1 local_830 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  string local_808;
  Move<vk::Handle<(vk::HandleType)14>_> local_7e8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_7c8;
  undefined1 local_7a8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragShaderModule;
  string local_780;
  Move<vk::Handle<(vk::HandleType)14>_> local_760;
  RefData<vk::Handle<(vk::HandleType)14>_> local_740;
  undefined1 local_720 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vtxShaderModule;
  Move<vk::Handle<(vk::HandleType)16>_> local_6f8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_6d8;
  undefined1 local_6b8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_688;
  RefData<vk::Handle<(vk::HandleType)23>_> local_668;
  undefined1 local_648 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_608;
  undefined1 local_5e8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  VkDescriptorBufferInfo descriptor;
  deUint32 size;
  BlockLayoutEntry *block_1;
  undefined1 auStack_588 [4];
  int blockNdx_3;
  deUint64 local_570;
  VkBuffer buffer;
  key_type_conflict local_55c;
  undefined1 local_558 [4];
  int blockNdx_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 totalSize;
  int blockNdx_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> offsets_1;
  Location LStack_500;
  int currentOffset;
  VkDescriptorSet local_4f8;
  VkDescriptorBufferInfo local_4f0;
  _Rb_tree_const_iterator<std::pair<const_int,_void_*>_> local_4d8;
  void *local_4d0;
  void *srcPtr;
  BlockLayoutEntry *block;
  undefined1 local_4b8 [4];
  int blockNdx;
  DescriptorSetUpdateBuilder descriptorSetUpdateBuilder;
  undefined1 local_468 [8];
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptors;
  undefined1 local_448 [4];
  int numBlocks;
  RefData<vk::Handle<(vk::HandleType)22>_> local_428;
  undefined1 local_408 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  VkDescriptorSetAllocateInfo descriptorSetAllocateInfo;
  RefData<vk::Handle<(vk::HandleType)21>_> local_3a0;
  undefined1 local_380 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  RefData<vk::Handle<(vk::HandleType)19>_> local_340;
  undefined1 local_320 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Move<vk::Handle<(vk::HandleType)13>_> local_2f8;
  RefData<vk::Handle<(vk::HandleType)13>_> local_2d8;
  undefined1 local_2b8 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorImageView;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_288;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_278;
  undefined1 local_268 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  RefData<vk::Handle<(vk::HandleType)9>_> local_238;
  undefined1 local_218 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> colorImage;
  int minUniformBufferOffsetAlignment;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1d8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_1c8;
  undefined1 local_1b8 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> indicesAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_188;
  undefined1 local_168 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> indicesBuffer;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_138;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_128;
  undefined1 local_118 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> positionsAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> local_f8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_d8;
  undefined1 local_b8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> positionsBuffer;
  deUint32 indices [6];
  undefined8 uStack_78;
  float positions [16];
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  UniformBlockCaseInstance *this_local;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar11 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  positions[0xf] =
       (float)Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  positions[10] = 1.0;
  positions[0xb] = 1.0;
  positions[0xc] = 0.0;
  positions[0xd] = 1.0;
  positions[6] = 1.0;
  positions[7] = -1.0;
  positions[8] = 0.0;
  positions[9] = 1.0;
  positions[2] = -1.0;
  positions[3] = 1.0;
  positions[4] = 0.0;
  positions[5] = 1.0;
  uStack_78 = 0xbf800000bf800000;
  positions[0] = 0.0;
  positions[1] = 1.0;
  positionsBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x100000000;
  createBuffer(&local_f8,(this->super_TestInstance).m_context,0x40,0x80);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d8,(Move *)&local_f8);
  uVar43 = (undefined4)local_d8.object.m_internal;
  uVar44 = (undefined4)(local_d8.object.m_internal >> 0x20);
  uVar45 = SUB84(local_d8.deleter.m_deviceIface,0);
  uVar46 = (undefined4)((ulong)local_d8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_deviceIface._0_4_ = uVar45;
  data_04.object.m_internal = local_d8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = uVar46;
  data_04.deleter.m_device = local_d8.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_d8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_b8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_f8);
  pCVar41 = (this->super_TestInstance).m_context;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_b8);
  indicesBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._4_4_ =
       ::vk::MemoryRequirement::HostVisible.m_flags;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_138,pCVar41,
             (VkBuffer)pHVar12->m_internal,::vk::MemoryRequirement::HostVisible);
  local_128 = de::details::MovePtr::operator_cast_to_PtrData(&local_138,(MovePtr *)pCVar41);
  data_00.ptr._4_4_ = uVar44;
  data_00.ptr._0_4_ = uVar43;
  data_00._8_4_ = uVar45;
  data_00._12_4_ = uVar46;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_118,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_138);
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
               &indicesAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                m_data.field_0x8,(this->super_TestInstance).m_context,0x18,0xc0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_188,
             (Move *)&indicesAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar43 = (undefined4)local_188.object.m_internal;
  uVar44 = (undefined4)(local_188.object.m_internal >> 0x20);
  uVar45 = SUB84(local_188.deleter.m_deviceIface,0);
  uVar46 = (undefined4)((ulong)local_188.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_deviceIface._0_4_ = uVar45;
  data_05.object.m_internal = local_188.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = uVar46;
  data_05.deleter.m_device = local_188.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_188.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_188.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_168,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &indicesAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  pCVar41 = (this->super_TestInstance).m_context;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_168);
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1d8,pCVar41,
             (VkBuffer)pHVar12->m_internal,::vk::MemoryRequirement::HostVisible);
  local_1c8 = de::details::MovePtr::operator_cast_to_PtrData(&local_1d8,(MovePtr *)pCVar41);
  data_01.ptr._4_4_ = uVar44;
  data_01.ptr._0_4_ = uVar43;
  data_01._8_4_ = uVar45;
  data_01._12_4_ = uVar46;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_1b8,data_01);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1d8);
  align = getminUniformBufferOffsetAlignment((this->super_TestInstance).m_context);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_118)
  ;
  pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
  ::deMemcpy(pvVar14,&uStack_78,0x40);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_118)
  ;
  VVar15 = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_118)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::flushMappedMemoryRange(vkd,device_00,VVar15,VVar16,0x40);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_1b8)
  ;
  pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
  ::deMemcpy(pvVar14,&positionsBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator,0x18);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_1b8)
  ;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_1b8)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::flushMappedMemoryRange
            (vkd,device_00,
             (VkDeviceMemory)
             colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator,
             VVar16,0x18);
  createImage2D((Move<vk::Handle<(vk::HandleType)9>_> *)
                &colorImageAlloc.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                 field_0x8,(this->super_TestInstance).m_context,100,100,VK_FORMAT_R8G8B8A8_UNORM,
                VK_IMAGE_TILING_OPTIMAL,0x11);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_238,
             (Move *)&colorImageAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar43 = (undefined4)local_238.object.m_internal;
  uVar44 = (undefined4)(local_238.object.m_internal >> 0x20);
  uVar45 = SUB84(local_238.deleter.m_deviceIface,0);
  uVar46 = (undefined4)((ulong)local_238.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_deviceIface._0_4_ = uVar45;
  data_06.object.m_internal = local_238.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = uVar46;
  data_06.deleter.m_device = local_238.deleter.m_device;
  data_06.deleter.m_allocator._0_4_ = (int)local_238.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_238.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_218,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  pCVar41 = (this->super_TestInstance).m_context;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_218);
  colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_ =
       ::vk::MemoryRequirement::Any.m_flags;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_288,pCVar41,
             (VkImage)pHVar17->m_internal,::vk::MemoryRequirement::Any);
  local_278 = de::details::MovePtr::operator_cast_to_PtrData(&local_288,(MovePtr *)pCVar41);
  data_02.ptr._4_4_ = uVar44;
  data_02.ptr._0_4_ = uVar43;
  data_02._8_4_ = uVar45;
  data_02._12_4_ = uVar46;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_268,data_02);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_288);
  pCVar41 = (this->super_TestInstance).m_context;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_218);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar17->m_internal;
  createAttachmentView
            (&local_2f8,pCVar41,
             (VkImage)descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                      deleter.m_allocator,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&local_2f8);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_2d8.deleter.m_deviceIface;
  data_07.object.m_internal = local_2d8.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d8.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device = local_2d8.deleter.m_device;
  data_07.deleter.m_allocator._0_4_ = (int)local_2d8.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_2d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_2b8,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_2f8);
  createDescriptorSetLayout
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator,this);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_340,
             (Move *)&descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                      m_allocator);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_340.deleter.m_deviceIface;
  data_08.object.m_internal = local_340.object.m_internal;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_340.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device = local_340.deleter.m_device;
  data_08.deleter.m_allocator._0_4_ = (int)local_340.deleter.m_allocator;
  data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_340.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_320,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&descriptorSetAllocateInfo.pSetLayouts,this);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3a0,(Move *)&descriptorSetAllocateInfo.pSetLayouts);
  data_09.deleter.m_deviceIface._0_4_ = (int)local_3a0.deleter.m_deviceIface;
  data_09.object.m_internal = local_3a0.object.m_internal;
  data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3a0.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_device = local_3a0.deleter.m_device;
  data_09.deleter.m_allocator._0_4_ = (int)local_3a0.deleter.m_allocator;
  data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_3a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_380,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&descriptorSetAllocateInfo.pSetLayouts);
  descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal.
  _0_4_ = 0x22;
  descriptorSetAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetAllocateInfo._4_4_ = 0;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_380);
  descriptorSetAllocateInfo.pNext = (void *)pHVar18->m_internal;
  descriptorSetAllocateInfo.descriptorPool.m_internal._0_4_ = 1;
  descriptorSetAllocateInfo._24_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_320);
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)local_448,vkd,device_00,
             (VkDescriptorSetAllocateInfo *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_428,(Move *)local_448);
  data_10.deleter.m_deviceIface._0_4_ = (int)local_428.deleter.m_deviceIface;
  data_10.object.m_internal = local_428.object.m_internal;
  data_10.deleter.m_deviceIface._4_4_ = (int)((ulong)local_428.deleter.m_deviceIface >> 0x20);
  data_10.deleter.m_device = local_428.deleter.m_device;
  data_10.deleter.m_pool.m_internal._0_4_ = (int)local_428.deleter.m_pool.m_internal;
  data_10.deleter.m_pool.m_internal._4_4_ = (int)(local_428.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_408,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)local_448);
  sVar19 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
           size(&this->m_layout->blocks);
  descriptors.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar19;
  sVar19 = (size_type)
           descriptors.
           super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  this_00 = (allocator<vk::VkDescriptorBufferInfo> *)
            ((long)&descriptorSetUpdateBuilder.m_copies.
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<vk::VkDescriptorBufferInfo>::allocator(this_00);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_468,sVar19,this_00);
  std::allocator<vk::VkDescriptorBufferInfo>::~allocator
            ((allocator<vk::VkDescriptorBufferInfo> *)
             ((long)&descriptorSetUpdateBuilder.m_copies.
                     super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_4b8);
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    for (block._4_4_ = 0;
        block._4_4_ <
        descriptors.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; block._4_4_ = block._4_4_ + 1) {
      srcPtr = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
               ::operator[](&this->m_layout->blocks,(long)block._4_4_);
      local_4d8._M_node =
           (_Base_ptr)
           std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
           find(this->m_blockPointers,(key_type_conflict *)((long)&block + 4));
      ppVar20 = std::_Rb_tree_const_iterator<std::pair<const_int,_void_*>_>::operator->(&local_4d8);
      local_4d0 = ppVar20->second;
      addUniformData(&local_4f0,this,*(deUint32 *)((long)srcPtr + 0x20),local_4d0);
      pvVar21 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ::operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                              *)local_468,(long)block._4_4_);
      pvVar21->range = local_4f0.range;
      (pvVar21->buffer).m_internal = local_4f0.buffer.m_internal;
      pvVar21->offset = local_4f0.offset;
      pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_408);
      local_4f8.m_internal = pHVar22->m_internal;
      LStack_500 = ::vk::DescriptorSetUpdateBuilder::Location::bindingArrayElement
                             (*(deUint32 *)((long)srcPtr + 0x44),*(deUint32 *)((long)srcPtr + 0x48))
      ;
      pvVar21 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ::operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                              *)local_468,(long)block._4_4_);
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                ((DescriptorSetUpdateBuilder *)local_4b8,local_4f8,&stack0xfffffffffffffb00,
                 VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,pvVar21);
    }
  }
  else {
    offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &totalSize);
    for (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ <
        descriptors.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      if (0 < align) {
        offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             deAlign32(offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,align);
      }
      uVar1 = offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      puVar23 = (uint *)std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&totalSize,
                                   (key_type_conflict *)
                                   ((long)&data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      *puVar23 = uVar1;
      pvVar24 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                ::operator[](&this->m_layout->blocks,
                             (long)data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           pvVar24->size + offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    }
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558,
               (ulong)(deUint32)
                      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
    for (local_55c = 0;
        size_00 = (deUint32)
                  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
        local_55c <
        descriptors.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_55c = local_55c + 1) {
      pmVar25 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&totalSize,&local_55c);
      pvVar26 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558,
                           (long)*pmVar25);
      buffer.m_internal =
           (deUint64)
           std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
           find(this->m_blockPointers,&local_55c);
      ppVar20 = std::_Rb_tree_const_iterator<std::pair<const_int,_void_*>_>::operator->
                          ((_Rb_tree_const_iterator<std::pair<const_int,_void_*>_> *)&buffer);
      pvVar14 = ppVar20->second;
      pvVar24 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                ::operator[](&this->m_layout->blocks,(long)local_55c);
      ::deMemcpy(pvVar26,pvVar14,(long)pvVar24->size);
    }
    pvVar26 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558,0);
    addUniformData((VkDescriptorBufferInfo *)auStack_588,this,size_00,pvVar26);
    local_570 = _auStack_588;
    for (block_1._4_4_ = 0;
        block_1._4_4_ <
        descriptors.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; block_1._4_4_ = block_1._4_4_ + 1)
    {
      pvVar24 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                ::operator[](&this->m_layout->blocks,(long)block_1._4_4_);
      dVar4 = local_570;
      uVar1 = pvVar24->size;
      puVar23 = (uint *)std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&totalSize,(key_type_conflict *)((long)&block_1 + 4));
      uVar2 = *puVar23;
      pvVar21 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ::operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                              *)local_468,(long)block_1._4_4_);
      pvVar21->range = (ulong)uVar1;
      (pvVar21->buffer).m_internal = dVar4;
      pvVar21->offset = (ulong)uVar2;
      pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_408);
      destSet.m_internal = pHVar22->m_internal;
      renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           ::vk::DescriptorSetUpdateBuilder::Location::bindingArrayElement
                     (pvVar24->bindingNdx,pvVar24->instanceNdx);
      pvVar21 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ::operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                              *)local_468,(long)block_1._4_4_);
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                ((DescriptorSetUpdateBuilder *)local_4b8,destSet,
                 (Location *)
                 &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                  m_allocator,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,pvVar21);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &totalSize);
  }
  ::vk::DescriptorSetUpdateBuilder::update((DescriptorSetUpdateBuilder *)local_4b8,vkd,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_4b8);
  createRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                   &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                    m_allocator,this,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_608,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_11.deleter.m_deviceIface._0_4_ = (int)local_608.deleter.m_deviceIface;
  data_11.object.m_internal = local_608.object.m_internal;
  data_11.deleter.m_deviceIface._4_4_ = (int)((ulong)local_608.deleter.m_deviceIface >> 0x20);
  data_11.deleter.m_device = local_608.deleter.m_device;
  data_11.deleter.m_allocator._0_4_ = (int)local_608.deleter.m_allocator;
  data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_608.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_5e8,data_11);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5e8);
  renderPass_00.m_internal = pHVar27->m_internal;
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_2b8);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar28->m_internal;
  createFramebuffer(&local_688,this,renderPass_00,
                    (VkImageView)
                    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                    m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_668,(Move *)&local_688);
  data_12.deleter.m_deviceIface._0_4_ = (int)local_668.deleter.m_deviceIface;
  data_12.object.m_internal = local_668.object.m_internal;
  data_12.deleter.m_deviceIface._4_4_ = (int)((ulong)local_668.deleter.m_deviceIface >> 0x20);
  data_12.deleter.m_device = local_668.deleter.m_device;
  data_12.deleter.m_allocator._0_4_ = (int)local_668.deleter.m_allocator;
  data_12.deleter.m_allocator._4_4_ = (int)((ulong)local_668.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_648,data_12);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_688);
  pCVar41 = (this->super_TestInstance).m_context;
  pHVar29 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_320);
  vtxShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar29->m_internal;
  createPipelineLayout
            (&local_6f8,pCVar41,
             (VkDescriptorSetLayout)
             vtxShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
             m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_6d8,(Move *)&local_6f8);
  data_13.deleter.m_deviceIface._0_4_ = (int)local_6d8.deleter.m_deviceIface;
  data_13.object.m_internal = local_6d8.object.m_internal;
  data_13.deleter.m_deviceIface._4_4_ = (int)((ulong)local_6d8.deleter.m_deviceIface >> 0x20);
  data_13.deleter.m_device = local_6d8.deleter.m_device;
  data_13.deleter.m_allocator._0_4_ = (int)local_6d8.deleter.m_allocator;
  data_13.deleter.m_allocator._4_4_ = (int)((ulong)local_6d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_6b8,data_13);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_6f8);
  pPVar30 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_780,"vert",
             (allocator<char> *)
             ((long)&fragShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar31 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar30,&local_780);
  ::vk::createShaderModule(&local_760,vkd,device_00,pPVar31,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_740,(Move *)&local_760);
  data_14.deleter.m_deviceIface._0_4_ = (int)local_740.deleter.m_deviceIface;
  data_14.object.m_internal = local_740.object.m_internal;
  data_14.deleter.m_deviceIface._4_4_ = (int)((ulong)local_740.deleter.m_deviceIface >> 0x20);
  data_14.deleter.m_device = local_740.deleter.m_device;
  data_14.deleter.m_allocator._0_4_ = (int)local_740.deleter.m_allocator;
  data_14.deleter.m_allocator._4_4_ = (int)((ulong)local_740.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_720,data_14);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_760);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fragShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar30 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"frag",
             (allocator<char> *)
             ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar31 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar30,&local_808);
  ::vk::createShaderModule(&local_7e8,vkd,device_00,pPVar31,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_7c8,(Move *)&local_7e8);
  data_15.deleter.m_deviceIface._0_4_ = (int)local_7c8.deleter.m_deviceIface;
  data_15.object.m_internal = local_7c8.object.m_internal;
  data_15.deleter.m_deviceIface._4_4_ = (int)((ulong)local_7c8.deleter.m_deviceIface >> 0x20);
  data_15.deleter.m_device = local_7c8.deleter.m_device;
  data_15.deleter.m_allocator._0_4_ = (int)local_7c8.deleter.m_allocator;
  data_15.deleter.m_allocator._4_4_ = (int)((ulong)local_7c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_7a8,data_15);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_7e8);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar32 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_720);
  vtxShaderModule_00.m_internal = pHVar32->m_internal;
  pHVar32 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_7a8);
  fragShaderModule_00.m_internal = pHVar32->m_internal;
  pHVar33 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_6b8);
  pipelineLayout_00.m_internal = pHVar33->m_internal;
  pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5e8);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar27->m_internal;
  createPipeline(&local_870,this,vtxShaderModule_00,fragShaderModule_00,pipelineLayout_00,
                 (VkRenderPass)
                 cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_850,(Move *)&local_870);
  data_16.deleter.m_deviceIface._0_4_ = (int)local_850.deleter.m_deviceIface;
  data_16.object.m_internal = local_850.object.m_internal;
  data_16.deleter.m_deviceIface._4_4_ = (int)((ulong)local_850.deleter.m_deviceIface >> 0x20);
  data_16.deleter.m_device = local_850.deleter.m_device;
  data_16.deleter.m_allocator._0_4_ = (int)local_850.deleter.m_allocator;
  data_16.deleter.m_allocator._4_4_ = (int)((ulong)local_850.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_830,data_16);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_870);
  createCmdPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                (this->super_TestInstance).m_context);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_8d0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_17.deleter.m_deviceIface._0_4_ = (int)local_8d0.deleter.m_deviceIface;
  data_17.object.m_internal = local_8d0.object.m_internal;
  data_17.deleter.m_deviceIface._4_4_ = (int)((ulong)local_8d0.deleter.m_deviceIface >> 0x20);
  data_17.deleter.m_device = local_8d0.deleter.m_device;
  data_17.deleter.m_allocator._0_4_ = (int)local_8d0.deleter.m_allocator;
  data_17.deleter.m_allocator._4_4_ = (int)((ulong)local_8d0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_8b0,data_17);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pCVar41 = (this->super_TestInstance).m_context;
  pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_8b0);
  readImageBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar34->m_internal;
  createCmdBuffer(&local_950,pCVar41,
                  (VkCommandPool)
                  readImageBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                  m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_930,(Move *)&local_950);
  data_18.deleter.m_deviceIface._0_4_ = (int)local_930.deleter.m_deviceIface;
  data_18.object = local_930.object;
  data_18.deleter.m_deviceIface._4_4_ = (int)((ulong)local_930.deleter.m_deviceIface >> 0x20);
  data_18.deleter.m_device = local_930.deleter.m_device;
  data_18.deleter.m_pool.m_internal._0_4_ = (int)local_930.deleter.m_pool.m_internal;
  data_18.deleter.m_pool.m_internal._4_4_ = (int)(local_930.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_910,data_18);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_950);
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
               &readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                .m_data.field_0x8,(this->super_TestInstance).m_context,40000,2);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_998,
             (Move *)&readImageAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar43 = (undefined4)local_998.object.m_internal;
  uVar44 = (undefined4)(local_998.object.m_internal >> 0x20);
  uVar45 = SUB84(local_998.deleter.m_deviceIface,0);
  uVar46 = (undefined4)((ulong)local_998.deleter.m_deviceIface >> 0x20);
  data_19.deleter.m_deviceIface._0_4_ = uVar45;
  data_19.object.m_internal = local_998.object.m_internal;
  data_19.deleter.m_deviceIface._4_4_ = uVar46;
  data_19.deleter.m_device = local_998.deleter.m_device;
  data_19.deleter.m_allocator._0_4_ = (int)local_998.deleter.m_allocator;
  data_19.deleter.m_allocator._4_4_ = (int)((ulong)local_998.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_978,data_19);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  pCVar41 = (this->super_TestInstance).m_context;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_978);
  beginInfo.pInheritanceInfo._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_9e8,pCVar41,
             (VkBuffer)pHVar12->m_internal,::vk::MemoryRequirement::HostVisible);
  local_9d8 = de::details::MovePtr::operator_cast_to_PtrData(&local_9e8,(MovePtr *)pCVar41);
  data_03.ptr._4_4_ = uVar44;
  data_03.ptr._0_4_ = uVar43;
  data_03._8_4_ = uVar45;
  data_03._12_4_ = uVar46;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_9c8,data_03);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_9e8);
  beginInfo.pNext = (void *)0x0;
  beginInfo.flags = 0;
  beginInfo._20_4_ = 0;
  clearValue._8_8_ = 0x2a;
  beginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  beginInfo._4_4_ = 0;
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  VVar9 = (*vkd->_vptr_DeviceInterface[0x49])(vkd,*ppVVar35,(long)&clearValue + 8);
  ::vk::checkResult(VVar9,"vk.beginCommandBuffer(*cmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x6b3);
  VVar42 = ::vk::makeClearValueColorF32(0.125,0.25,0.75,1.0);
  clearValue.depthStencil = (VkClearDepthStencilValue)VVar42._8_8_;
  passBeginInfo.pClearValues = (VkClearValue *)VVar42.depthStencil;
  initializeBarrier.subresourceRange.layerCount = 0x2b;
  passBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  passBeginInfo._4_4_ = 0;
  pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5e8);
  passBeginInfo.pNext = (void *)pHVar27->m_internal;
  pHVar36 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_648);
  passBeginInfo.renderPass.m_internal = pHVar36->m_internal;
  passBeginInfo.framebuffer.m_internal._0_4_ = 0;
  passBeginInfo.framebuffer.m_internal._4_4_ = 0;
  passBeginInfo.renderArea.offset.x = 100;
  passBeginInfo.renderArea.offset.y = 100;
  passBeginInfo.renderArea.extent.width = 1;
  passBeginInfo._48_8_ = &passBeginInfo.pClearValues;
  local_ab0[0] = 0x2d;
  initializeBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  initializeBarrier._4_4_ = 0;
  initializeBarrier.pNext._0_4_ = 0;
  initializeBarrier.pNext._4_4_ = 0x100;
  initializeBarrier.srcAccessMask = 0;
  initializeBarrier.dstAccessMask = 2;
  initializeBarrier.oldLayout = (VkImageLayout)positions[0xf];
  initializeBarrier.newLayout = (VkImageLayout)positions[0xf];
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_218);
  initializeBarrier._32_8_ = pHVar17->m_internal;
  initializeBarrier.image.m_internal._0_4_ = 1;
  initializeBarrier.image.m_internal._4_4_ = 0;
  initializeBarrier.subresourceRange.aspectMask = 1;
  initializeBarrier.subresourceRange.baseMipLevel = 0;
  initializeBarrier.subresourceRange.levelCount = 1;
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  (*vkd->_vptr_DeviceInterface[0x6d])(vkd,*ppVVar35,1,0x8000,0,0,0,0,0,1,local_ab0);
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  (*vkd->_vptr_DeviceInterface[0x74])
            (vkd,*ppVVar35,&initializeBarrier.subresourceRange.layerCount,0);
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  pVVar3 = *ppVVar35;
  pHVar37 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_830);
  (*vkd->_vptr_DeviceInterface[0x4c])(vkd,pVVar3,0,pHVar37->m_internal);
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  pVVar3 = *ppVVar35;
  pHVar33 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_6b8);
  offsets[0] = pHVar33->m_internal;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_408);
  (*vkd->_vptr_DeviceInterface[0x56])(vkd,pVVar3,0,offsets[0],0,1,(int)pHVar22,0,0);
  local_ac8 = 0;
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  pVVar3 = *ppVVar35;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_b8);
  (*vkd->_vptr_DeviceInterface[0x58])(vkd,pVVar3,0,1,pHVar12,&local_ac8);
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  pVVar3 = *ppVVar35;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_168);
  renderFinishBarrier._64_8_ = pHVar12->m_internal;
  (*vkd->_vptr_DeviceInterface[0x57])(vkd,pVVar3,renderFinishBarrier._64_8_,0,1);
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  (*vkd->_vptr_DeviceInterface[0x5a])(vkd,*ppVVar35,6,1,0,0,0);
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  (*vkd->_vptr_DeviceInterface[0x76])(vkd,*ppVVar35);
  local_b18[0] = 0x2d;
  renderFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderFinishBarrier._4_4_ = 0;
  renderFinishBarrier.pNext._0_4_ = 0x100;
  renderFinishBarrier.pNext._4_4_ = 0x800;
  renderFinishBarrier.srcAccessMask = 2;
  renderFinishBarrier.dstAccessMask = 6;
  renderFinishBarrier.oldLayout = (VkImageLayout)positions[0xf];
  renderFinishBarrier.newLayout = (VkImageLayout)positions[0xf];
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_218);
  renderFinishBarrier._32_8_ = pHVar17->m_internal;
  renderFinishBarrier.image.m_internal._0_4_ = 1;
  renderFinishBarrier.image.m_internal._4_4_ = 0;
  renderFinishBarrier.subresourceRange.aspectMask = 1;
  renderFinishBarrier.subresourceRange.baseMipLevel = 0;
  renderFinishBarrier.subresourceRange.levelCount = 1;
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  (*vkd->_vptr_DeviceInterface[0x6d])(vkd,*ppVVar35,0x8000,0x1000,0,0,0,0,0,1,local_b18);
  copyParams.imageSubresource.baseArrayLayer = 0;
  copyParams.imageSubresource.layerCount = 0;
  copyParams.imageOffset.x = 0;
  copyParams.imageOffset.y = 100;
  copyParams.bufferRowLength = 1;
  copyParams.bufferImageHeight = 0;
  copyParams.imageSubresource.aspectMask = 0;
  copyParams.imageSubresource.mipLevel = 1;
  uStack_b58 = 0;
  copyParams.bufferOffset = 0x6400000064;
  copyParams.imageOffset.z = 100;
  copyParams.imageExtent.width = 1;
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  pVVar3 = *ppVVar35;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_218);
  dVar4 = pHVar17->m_internal;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_978);
  (*vkd->_vptr_DeviceInterface[99])(vkd,pVVar3,dVar4,6,pHVar12->m_internal,1,(int)&uStack_b58);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._0_4_ = 0x2c;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_978);
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,*ppVVar35,0x1000,0x4000,0,0,0,1,
             &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,0,0);
  ppVVar35 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  VVar9 = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,*ppVVar35);
  ::vk::checkResult(VVar9,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x72e);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores,vkd,
                    device_00,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_be0,(Move *)&submitInfo.pSignalSemaphores)
  ;
  data_20.deleter.m_deviceIface._0_4_ = (int)local_be0.deleter.m_deviceIface;
  data_20.object.m_internal = local_be0.object.m_internal;
  data_20.deleter.m_deviceIface._4_4_ = (int)((ulong)local_be0.deleter.m_deviceIface >> 0x20);
  data_20.deleter.m_device = local_be0.deleter.m_device;
  data_20.deleter.m_allocator._0_4_ = (int)local_be0.deleter.m_allocator;
  data_20.deleter.m_allocator._4_4_ = (int)((ulong)local_be0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_bc0,data_20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_c48 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
  pHVar38 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_bc0);
  VVar9 = (*vkd->_vptr_DeviceInterface[2])(vkd,pVVar11,1,&uStack_c48,pHVar38->m_internal);
  ::vk::checkResult(VVar9,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x741);
  pHVar38 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_bc0);
  VVar9 = (*vkd->_vptr_DeviceInterface[0x16])(vkd,device_00,1,pHVar38,1,0xffffffffffffffff);
  ::vk::checkResult(VVar9,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x742);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_bc0);
  tcu::Surface::Surface((Surface *)&textureFormat,100,100);
  tcu::TextureFormat::TextureFormat((TextureFormat *)&imgAccess.m_data,RGBA,UNORM_INT8);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_9c8)
  ;
  pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&bufferSize,(TextureFormat *)&imgAccess.m_data,100,100,1,
             pvVar14);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_9c8)
  ;
  VVar15 = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_9c8)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::invalidateMappedMemoryRange(vkd,device_00,VVar15,VVar16,40000);
  tcu::Surface::getAccess((PixelBufferAccess *)&numFailedPixels,(Surface *)&textureFormat);
  tcu::copy((EVP_PKEY_CTX *)&numFailedPixels,(EVP_PKEY_CTX *)&bufferSize);
  y = (int)tcu::RGBA::white();
  x = 0;
  for (local_cdc = 0; iVar7 = local_cdc, iVar10 = tcu::Surface::getHeight((Surface *)&textureFormat)
      , iVar7 < iVar10; local_cdc = local_cdc + 1) {
    for (local_ce0 = 0; iVar7 = local_ce0,
        iVar10 = tcu::Surface::getWidth((Surface *)&textureFormat), iVar7 < iVar10;
        local_ce0 = local_ce0 + 1) {
      log._4_4_ = tcu::Surface::getPixel((Surface *)&textureFormat,local_ce0,local_cdc);
      bVar8 = tcu::RGBA::operator!=((RGBA *)((long)&log + 4),(RGBA *)&y);
      if (bVar8) {
        x = x + 1;
      }
    }
  }
  if (x < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12b0,"Full white image ok",&local_12b1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_12b0);
    std::__cxx11::string::~string((string *)&local_12b0);
    std::allocator<char>::~allocator(&local_12b1);
  }
  else {
    this_01 = Context::getTestContext((this->super_TestInstance).m_context);
    this_02 = tcu::TestContext::getLog(this_01);
    local_cf0 = this_02;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_da0,"Image",&local_da1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc8,"Rendered image",&local_dc9);
    tcu::LogImage::LogImage
              (&local_d80,&local_da0,&local_dc8,(Surface *)&textureFormat,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(this_02,&local_d80);
    tcu::LogImage::~LogImage(&local_d80);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::allocator<char>::~allocator(&local_dc9);
    std::__cxx11::string::~string((string *)&local_da0);
    std::allocator<char>::~allocator(&local_da1);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&blockNdx_4,local_cf0,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar39 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&blockNdx_4,
                         (char (*) [30])"Image comparison failed, got ");
    pMVar39 = tcu::MessageBuilder::operator<<(pMVar39,&x);
    pMVar39 = tcu::MessageBuilder::operator<<(pMVar39,(char (*) [18])0x13231da);
    tcu::MessageBuilder::operator<<(pMVar39,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&blockNdx_4);
    for (block_2 = (BlockLayoutEntry *)0x0; pBVar6 = block_2,
        pBVar40 = (BlockLayoutEntry *)
                  std::
                  vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
                  size(&this->m_layout->blocks), pBVar6 < pBVar40;
        block_2 = (BlockLayoutEntry *)&(block_2->name).field_0x1) {
      local_f60 = std::
                  vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
                  operator[](&this->m_layout->blocks,(size_type)block_2);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&uniformNdx,local_cf0,(BeginMessageToken *)&tcu::TestLog::Message
                );
      pMVar39 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&uniformNdx,(char (*) [14])"Block index: ");
      pMVar39 = tcu::MessageBuilder::operator<<(pMVar39,(unsigned_long *)&block_2);
      pMVar39 = tcu::MessageBuilder::operator<<(pMVar39,(char (*) [9])" infos: ");
      pMVar39 = tcu::MessageBuilder::operator<<(pMVar39,local_f60);
      tcu::MessageBuilder::operator<<(pMVar39,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&uniformNdx);
    }
    for (local_10e8 = 0; uVar5 = local_10e8,
        sVar19 = std::
                 vector<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                 ::size(&this->m_layout->uniforms), uVar5 < sVar19; local_10e8 = local_10e8 + 1) {
      tcu::TestLog::operator<<(&local_1268,local_cf0,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar39 = tcu::MessageBuilder::operator<<(&local_1268,(char (*) [16])"Uniform index: ");
      pMVar39 = tcu::MessageBuilder::operator<<(pMVar39,&local_10e8);
      pMVar39 = tcu::MessageBuilder::operator<<(pMVar39,(char (*) [9])" infos: ");
      value = std::
              vector<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>::
              operator[](&this->m_layout->uniforms,local_10e8);
      pMVar39 = tcu::MessageBuilder::operator<<(pMVar39,value);
      tcu::MessageBuilder::operator<<(pMVar39,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1268);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1288,"Detected non-white pixels",&local_1289);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1288);
    std::__cxx11::string::~string((string *)&local_1288);
    std::allocator<char>::~allocator(&local_1289);
  }
  local_1290 = 1;
  tcu::Surface::~Surface((Surface *)&textureFormat);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_9c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_978);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_910);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_8b0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_830);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_7a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_720);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_6b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_648);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_5e8);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::~vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_468);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_408);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_380);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_320);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_2b8);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_268);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_218);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_1b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_168);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_118);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus UniformBlockCaseInstance::iterate (void)
{
	const vk::DeviceInterface&		vk					= m_context.getDeviceInterface();
	const vk::VkDevice				device				= m_context.getDevice();
	const vk::VkQueue				queue				= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const float positions[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f, +1.0f, 0.0f, 1.0f,
		+1.0f, -1.0f, 0.0f, 1.0f,
		+1.0f, +1.0f, 0.0f, 1.0f
	};

	const deUint32 indices[] = { 0, 1, 2, 2, 1, 3 };

	vk::Unique<VkBuffer>				positionsBuffer		(createBuffer(m_context, sizeof(positions), vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
	de::UniquePtr<Allocation>			positionsAlloc		(allocateAndBindMemory(m_context, *positionsBuffer, MemoryRequirement::HostVisible));
	vk::Unique<VkBuffer>				indicesBuffer		(createBuffer(m_context, sizeof(indices), vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT|vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
	de::UniquePtr<Allocation>			indicesAlloc		(allocateAndBindMemory(m_context, *indicesBuffer, MemoryRequirement::HostVisible));

	int minUniformBufferOffsetAlignment = getminUniformBufferOffsetAlignment(m_context);

	// Upload attrbiutes data
	{
		deMemcpy(positionsAlloc->getHostPtr(), positions, sizeof(positions));
		flushMappedMemoryRange(vk, device, positionsAlloc->getMemory(), positionsAlloc->getOffset(), sizeof(positions));

		deMemcpy(indicesAlloc->getHostPtr(), indices, sizeof(indices));
		flushMappedMemoryRange(vk, device, indicesAlloc->getMemory(), indicesAlloc->getOffset(), sizeof(indices));
	}

	vk::Unique<VkImage>					colorImage			(createImage2D(m_context,
																			RENDER_WIDTH,
																			RENDER_HEIGHT,
																			vk::VK_FORMAT_R8G8B8A8_UNORM,
																			vk::VK_IMAGE_TILING_OPTIMAL,
																			vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT));
	de::UniquePtr<Allocation>			colorImageAlloc		(allocateAndBindMemory(m_context, *colorImage, MemoryRequirement::Any));
	vk::Unique<VkImageView>				colorImageView		(createAttachmentView(m_context, *colorImage, vk::VK_FORMAT_R8G8B8A8_UNORM));

	vk::Unique<VkDescriptorSetLayout>	descriptorSetLayout	(createDescriptorSetLayout());
	vk::Unique<VkDescriptorPool>		descriptorPool		(createDescriptorPool());

	const VkDescriptorSetAllocateInfo	descriptorSetAllocateInfo =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		*descriptorPool,									// VkDescriptorPool				descriptorPool;
		1u,													// deUint32						setLayoutCount;
		&descriptorSetLayout.get()							// const VkDescriptorSetLayout*	pSetLayouts;
	};

	vk::Unique<VkDescriptorSet>			descriptorSet(vk::allocateDescriptorSet(vk, device, &descriptorSetAllocateInfo));
	int									numBlocks = (int)m_layout.blocks.size();
	std::vector<vk::VkDescriptorBufferInfo>	descriptors(numBlocks);

	// Upload uniform data
	{
		vk::DescriptorSetUpdateBuilder	descriptorSetUpdateBuilder;

		if (m_bufferMode == UniformBlockCase::BUFFERMODE_PER_BLOCK)
		{
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
				const void*	srcPtr = m_blockPointers.find(blockNdx)->second;

				descriptors[blockNdx] = addUniformData(block.size, srcPtr);
				descriptorSetUpdateBuilder.writeSingle(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::bindingArrayElement(block.bindingNdx, block.instanceNdx),
														VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptors[blockNdx]);
			}
		}
		else
		{
			int currentOffset = 0;
			std::map<int, int> offsets;
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				if (minUniformBufferOffsetAlignment > 0)
					currentOffset = deAlign32(currentOffset, minUniformBufferOffsetAlignment);
				offsets[blockNdx] = currentOffset;
				currentOffset += m_layout.blocks[blockNdx].size;
			}

			deUint32 totalSize = currentOffset;

			// Make a copy of the data that satisfies the device's min uniform buffer alignment
			std::vector<deUint8> data;
			data.resize(totalSize);
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				deMemcpy(&data[offsets[blockNdx]], m_blockPointers.find(blockNdx)->second, m_layout.blocks[blockNdx].size);
			}

			vk::VkBuffer buffer = addUniformData(totalSize, &data[0]).buffer;

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
				deUint32 size = block.size;

				const VkDescriptorBufferInfo	descriptor =
				{
					buffer,							// VkBuffer		buffer;
					(deUint32)offsets[blockNdx],	// VkDeviceSize	offset;
					size,							// VkDeviceSize	range;
				};

				descriptors[blockNdx] = descriptor;
				descriptorSetUpdateBuilder.writeSingle(*descriptorSet,
														vk::DescriptorSetUpdateBuilder::Location::bindingArrayElement(block.bindingNdx, block.instanceNdx),
														VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
														&descriptors[blockNdx]);
			}
		}

		descriptorSetUpdateBuilder.update(vk, device);
	}

	vk::Unique<VkRenderPass>			renderPass			(createRenderPass(vk::VK_FORMAT_R8G8B8A8_UNORM));
	vk::Unique<VkFramebuffer>			framebuffer			(createFramebuffer(*renderPass, *colorImageView));
	vk::Unique<VkPipelineLayout>		pipelineLayout		(createPipelineLayout(m_context, *descriptorSetLayout));

	vk::Unique<VkShaderModule>			vtxShaderModule		(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("vert"), 0));
	vk::Unique<VkShaderModule>			fragShaderModule	(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("frag"), 0));
	vk::Unique<VkPipeline>				pipeline			(createPipeline(*vtxShaderModule, *fragShaderModule, *pipelineLayout, *renderPass));
	vk::Unique<VkCommandPool>			cmdPool				(createCmdPool(m_context));
	vk::Unique<VkCommandBuffer>			cmdBuffer			(createCmdBuffer(m_context, *cmdPool));
	vk::Unique<VkBuffer>				readImageBuffer		(createBuffer(m_context, (vk::VkDeviceSize)(RENDER_WIDTH * RENDER_HEIGHT * 4), vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	de::UniquePtr<Allocation>			readImageAlloc		(allocateAndBindMemory(m_context, *readImageBuffer, vk::MemoryRequirement::HostVisible));

	// Record command buffer
	const vk::VkCommandBufferBeginInfo beginInfo	=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0u,													// VkCommandBufferUsageFlags		flags;
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &beginInfo));

	const vk::VkClearValue clearValue = vk::makeClearValueColorF32(0.125f, 0.25f, 0.75f, 1.0f);
	const vk::VkRenderPassBeginInfo passBeginInfo	=
	{
		vk::VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType		sType;
		DE_NULL,										// const void*			pNext;
		*renderPass,									// VkRenderPass			renderPass;
		*framebuffer,									// VkFramebuffer		framebuffer;
		{ { 0, 0 }, { RENDER_WIDTH, RENDER_HEIGHT } },	// VkRect2D				renderArea;
		1u,												// deUint32				clearValueCount;
		&clearValue,									// const VkClearValue*	pClearValues;
	};

	// Add barrier for initializing image state
	{
		const vk::VkImageMemoryBarrier  initializeBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
			DE_NULL,										// const void*				pNext
			0,												// VVkAccessFlags			srcAccessMask;
			vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			vk::VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout			oldLayout;
			vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			queueFamilyIndex,								// deUint32					srcQueueFamilyIndex;
			queueFamilyIndex,								// deUint32					dstQueueFamilyIndex;
			*colorImage,									// VkImage					image;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,			// VkImageAspectFlags	aspectMask;
				0u,										// deUint32				baseMipLevel;
				1u,										// deUint32				mipLevels;
				0u,										// deUint32				baseArraySlice;
				1u,										// deUint32				arraySize;
			}												// VkImageSubresourceRange	subresourceRange
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, (vk::VkDependencyFlags)0,
			0, (const vk::VkMemoryBarrier*)DE_NULL,
			0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
			1, &initializeBarrier);
	}

	vk.cmdBeginRenderPass(*cmdBuffer, &passBeginInfo, vk::VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &*descriptorSet, 0u, DE_NULL);

	const vk::VkDeviceSize offsets[] = { 0u };
	vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &*positionsBuffer, offsets);
	vk.cmdBindIndexBuffer(*cmdBuffer, *indicesBuffer, (vk::VkDeviceSize)0, vk::VK_INDEX_TYPE_UINT32);

	vk.cmdDrawIndexed(*cmdBuffer, DE_LENGTH_OF_ARRAY(indices), 1u, 0u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	// Add render finish barrier
	{
		const vk::VkImageMemoryBarrier  renderFinishBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
			DE_NULL,										// const void*				pNext
			vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// VVkAccessFlags			srcAccessMask;
			vk::VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
			vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			oldLayout;
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
			queueFamilyIndex,								// deUint32					srcQueueFamilyIndex;
			queueFamilyIndex,								// deUint32					dstQueueFamilyIndex;
			*colorImage,									// VkImage					image;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,			// VkImageAspectFlags	aspectMask;
				0u,										// deUint32				baseMipLevel;
				1u,										// deUint32				mipLevels;
				0u,										// deUint32				baseArraySlice;
				1u,										// deUint32				arraySize;
			}												// VkImageSubresourceRange	subresourceRange
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0,
							  0, (const vk::VkMemoryBarrier*)DE_NULL,
							  0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
							  1, &renderFinishBarrier);
	}

	// Add Image->Buffer copy command
	{
		const vk::VkBufferImageCopy copyParams =
		{
			(vk::VkDeviceSize)0u,					// VkDeviceSize				bufferOffset;
			(deUint32)RENDER_WIDTH,					// deUint32					bufferRowLength;
			(deUint32)RENDER_HEIGHT,				// deUint32					bufferImageHeight;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,	// VkImageAspect	aspect;
				0u,								// deUint32			mipLevel;
				0u,								// deUint32			arrayLayer;
				1u,								// deUint32			arraySize;
			},										// VkImageSubresourceCopy	imageSubresource
			{ 0u, 0u, 0u },							// VkOffset3D				imageOffset;
			{ RENDER_WIDTH, RENDER_HEIGHT, 1u }		// VkExtent3D				imageExtent;
		};

		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *readImageBuffer, 1u, &copyParams);
	}

	// Add copy finish barrier
	{
		const vk::VkBufferMemoryBarrier copyFinishBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType		sType;
			DE_NULL,											// const void*			pNext;
			VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags		srcAccessMask;
			VK_ACCESS_HOST_READ_BIT,							// VkAccessFlags		dstAccessMask;
			queueFamilyIndex,									// deUint32				srcQueueFamilyIndex;
			queueFamilyIndex,									// deUint32				destQueueFamilyIndex;
			*readImageBuffer,									// VkBuffer				buffer;
			0u,													// VkDeviceSize			offset;
			(vk::VkDeviceSize)(RENDER_WIDTH * RENDER_HEIGHT * 4)// VkDeviceSize			size;
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0,
							  0, (const vk::VkMemoryBarrier*)DE_NULL,
							  1, &copyFinishBarrier,
							  0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	// Submit the command buffer
	{
		const Unique<vk::VkFence> fence(vk::createFence(vk, device));

		const VkSubmitInfo			submitInfo	=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,						// const void*				pNext;
			0u,								// deUint32					waitSemaphoreCount;
			DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
			(const VkPipelineStageFlags*)DE_NULL,
			1u,								// deUint32					commandBufferCount;
			&cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0u,								// deUint32					signalSemaphoreCount;
			DE_NULL							// const VkSemaphore*		pSignalSemaphores;
		};

		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));
	}

	// Read back the results
	tcu::Surface surface(RENDER_WIDTH, RENDER_HEIGHT);
	{
		const tcu::TextureFormat textureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
		const tcu::ConstPixelBufferAccess imgAccess(textureFormat, RENDER_WIDTH, RENDER_HEIGHT, 1, readImageAlloc->getHostPtr());
		const vk::VkDeviceSize bufferSize = RENDER_WIDTH * RENDER_HEIGHT * 4;
		invalidateMappedMemoryRange(vk, device, readImageAlloc->getMemory(), readImageAlloc->getOffset(), bufferSize);

		tcu::copy(surface.getAccess(), imgAccess);
	}

	// Check if the result image is all white
	tcu::RGBA white(tcu::RGBA::white());
	int numFailedPixels = 0;

	for (int y = 0; y < surface.getHeight(); y++)
	{
		for (int x = 0; x < surface.getWidth(); x++)
		{
			if (surface.getPixel(x, y) != white)
				numFailedPixels += 1;
		}
	}

	if (numFailedPixels > 0)
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		log << tcu::TestLog::Image("Image", "Rendered image", surface);
		log << tcu::TestLog::Message << "Image comparison failed, got " << numFailedPixels << " non-white pixels" << tcu::TestLog::EndMessage;

		for (size_t blockNdx = 0; blockNdx < m_layout.blocks.size(); blockNdx++)
		{
			const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
			log << tcu::TestLog::Message << "Block index: " << blockNdx << " infos: " << block << tcu::TestLog::EndMessage;
		}

		for (size_t uniformNdx = 0; uniformNdx < m_layout.uniforms.size(); uniformNdx++)
		{
			log << tcu::TestLog::Message << "Uniform index: " << uniformNdx << " infos: " << m_layout.uniforms[uniformNdx] << tcu::TestLog::EndMessage;
		}

		return tcu::TestStatus::fail("Detected non-white pixels");
	}
	else
		return tcu::TestStatus::pass("Full white image ok");
}